

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ans_msb.hpp
# Opt level: O2

uint32_t __thiscall ans_msb_decode::decode_sym(ans_msb_decode *this,uint64_t *state,uint8_t **in_u8)

{
  pointer pdVar1;
  uint8_t *puVar2;
  uint32_t uVar3;
  ulong uVar4;
  ulong uVar5;
  
  pdVar1 = (this->table).super__Vector_base<dec_entry_msb,_std::allocator<dec_entry_msb>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar4 = this->frame_mask & *state;
  uVar5 = (ulong)pdVar1[uVar4].offset +
          (*state >> ((ulong)(byte)this->frame_log2 & 0x3f)) * (ulong)pdVar1[uVar4].freq;
  *state = uVar5;
  if (uVar5 < this->lower_bound) {
    puVar2 = *in_u8;
    *in_u8 = puVar2 + -4;
    *state = (ulong)*(uint *)(puVar2 + -4) | uVar5 << 0x20;
  }
  uVar3 = ans_msb_undo_mapping(pdVar1 + uVar4,in_u8);
  return uVar3;
}

Assistant:

uint32_t decode_sym(uint64_t& state, const uint8_t*& in_u8)
    {
        const auto& entry = table[state & frame_mask];
        state = uint64_t(entry.freq) * (state >> frame_log2)
            + uint64_t(entry.offset);
        if (state < lower_bound) {
            in_u8 -= sizeof(uint32_t);
            auto in_ptr_u32 = reinterpret_cast<const uint32_t*>(in_u8);
            state = state << constants::RADIX_LOG2 | uint64_t(*in_ptr_u32);
        }
        auto decoded_sym = ans_msb_undo_mapping(entry, in_u8);
        return decoded_sym;
    }